

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_encoder.cc
# Opt level: O3

bool __thiscall
draco::SequentialAttributeEncoder::EncodeValues
          (SequentialAttributeEncoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,EncoderBuffer *out_buffer)

{
  PointAttribute *pPVar1;
  size_t __n;
  bool bVar2;
  uint uVar3;
  void *__dest;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pIVar7;
  pointer pIVar8;
  
  uVar5 = (ulong)(int)(this->attribute_->super_GeometryAttribute).byte_stride_;
  __dest = operator_new__(uVar5);
  pIVar7 = (point_ids->
           super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar8 = (point_ids->
           super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar8 != pIVar7) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      pPVar1 = this->attribute_;
      uVar3 = pIVar7[uVar4].value_;
      if (pPVar1->identity_mapping_ == false) {
        uVar3 = (pPVar1->indices_map_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
      }
      __n = (pPVar1->super_GeometryAttribute).byte_stride_;
      memcpy(__dest,(void *)((long)(((pPVar1->super_GeometryAttribute).buffer_)->data_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                             (pPVar1->super_GeometryAttribute).byte_offset_ + uVar3 * __n),__n);
      if (out_buffer->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)out_buffer,
                   (out_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,__dest,(long)__dest + uVar5);
        pIVar7 = (point_ids->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pIVar8 = (point_ids->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      bVar2 = uVar6 < (ulong)((long)pIVar8 - (long)pIVar7 >> 2);
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  operator_delete__(__dest);
  return true;
}

Assistant:

bool SequentialAttributeEncoder::EncodeValues(
    const std::vector<PointIndex> &point_ids, EncoderBuffer *out_buffer) {
  const int entry_size = static_cast<int>(attribute_->byte_stride());
  const std::unique_ptr<uint8_t[]> value_data_ptr(new uint8_t[entry_size]);
  uint8_t *const value_data = value_data_ptr.get();
  // Encode all attribute values in their native raw format.
  for (uint32_t i = 0; i < point_ids.size(); ++i) {
    const AttributeValueIndex entry_id = attribute_->mapped_index(point_ids[i]);
    attribute_->GetValue(entry_id, value_data);
    out_buffer->Encode(value_data, entry_size);
  }
  return true;
}